

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O2

Offset<MyGame::Example::Monster>
MyGame::Example::CreateMonster
          (FlatBufferBuilder *_fbb,Vec3 *pos,int16_t mana,int16_t hp,
          Offset<flatbuffers::String> name,Offset<flatbuffers::Vector<unsigned_char>_> inventory,
          int8_t color,uint8_t test_type,Offset<void> test,
          Offset<flatbuffers::Vector<const_MyGame::Example::Test_*>_> test4)

{
  Offset<MyGame::Example::Monster> OVar1;
  MonsterBuilder local_40;
  
  local_40.fbb_ = _fbb;
  local_40.start_ = flatbuffers::FlatBufferBuilder::StartTable(_fbb);
  MonsterBuilder::add_test4(&local_40,test4);
  MonsterBuilder::add_test(&local_40,test);
  MonsterBuilder::add_inventory(&local_40,inventory);
  MonsterBuilder::add_name(&local_40,name);
  MonsterBuilder::add_pos(&local_40,pos);
  MonsterBuilder::add_hp(&local_40,hp);
  MonsterBuilder::add_mana(&local_40,mana);
  MonsterBuilder::add_test_type(&local_40,test_type);
  MonsterBuilder::add_color(&local_40,color);
  OVar1 = MonsterBuilder::Finish(&local_40);
  return (Offset<MyGame::Example::Monster>)OVar1.o;
}

Assistant:

inline flatbuffers::Offset<Monster> CreateMonster(flatbuffers::FlatBufferBuilder &_fbb, const Vec3 *pos, int16_t mana, int16_t hp, flatbuffers::Offset<flatbuffers::String> name, flatbuffers::Offset<flatbuffers::Vector<uint8_t>> inventory, int8_t color, uint8_t test_type, flatbuffers::Offset<void> test, flatbuffers::Offset<flatbuffers::Vector<const Test *>> test4) {
  MonsterBuilder builder_(_fbb);
  builder_.add_test4(test4);
  builder_.add_test(test);
  builder_.add_inventory(inventory);
  builder_.add_name(name);
  builder_.add_pos(pos);
  builder_.add_hp(hp);
  builder_.add_mana(mana);
  builder_.add_test_type(test_type);
  builder_.add_color(color);
  return builder_.Finish();
}